

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O2

Vec_Flt_t * Abc_NtkTestCreateArrivals(int nInputs)

{
  Vec_Flt_t *p;
  ulong uVar1;
  ulong uVar2;
  
  p = Vec_FltAlloc(nInputs);
  uVar2 = 0;
  uVar1 = (ulong)(uint)nInputs;
  if (nInputs < 1) {
    uVar1 = uVar2;
  }
  while( true ) {
    if ((int)uVar1 == 0) break;
    Vec_FltPush(p,(float)(int)(uVar2 % 10));
    uVar2 = (ulong)((int)uVar2 + 1);
    uVar1 = (ulong)((int)uVar1 - 1);
  }
  return p;
}

Assistant:

Vec_Flt_t * Abc_NtkTestCreateArrivals( int nInputs )
{
    Vec_Flt_t * p;
    int i;
    p = Vec_FltAlloc( nInputs );
    for ( i = 0; i < nInputs; i++ )
        Vec_FltPush( p, 1.0*(i % 10) );
    return p;
}